

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestDiscard(void)

{
  size_type sVar1;
  OutputBuffer *pOVar2;
  lazy_ostream *plVar3;
  element_type *this;
  ulong uVar4;
  int chunks;
  uint uStack_80c;
  _func_int **local_808;
  size_t remainder;
  undefined8 local_7f8;
  OutputBuffer ob;
  size_t dataSize;
  lazy_ostream local_7d0;
  undefined8 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  const_string local_7a0;
  const_string local_790;
  char *local_780;
  char *local_778;
  const_string local_770;
  const_string local_760;
  char *local_750;
  char *local_748;
  const_string local_740;
  const_string local_730;
  char *local_720;
  char *local_718;
  const_string local_710;
  const_string local_700;
  char *local_6f0;
  char *local_6e8;
  const_string local_6e0;
  const_string local_6d0;
  char *local_6c0;
  char *local_6b8;
  const_string local_6b0;
  const_string local_6a0;
  char *local_690;
  char *local_688;
  const_string local_680;
  const_string local_670;
  char *local_660;
  char *local_658;
  const_string local_650;
  const_string local_640;
  char *local_630;
  char *local_628;
  const_string local_620;
  const_string local_610;
  char *local_600;
  char *local_5f8;
  const_string local_5f0;
  const_string local_5e0;
  char *local_5d0;
  char *local_5c8;
  const_string local_5c0;
  const_string local_5b0;
  char *local_5a0;
  char *local_598;
  const_string local_590;
  const_string local_580;
  char *local_570;
  char *local_568;
  const_string local_560;
  const_string local_550;
  char *local_540;
  char *local_538;
  const_string local_530;
  const_string local_520;
  char *local_510;
  char *local_508;
  const_string local_500;
  const_string local_4f0;
  char *local_4e0;
  char *local_4d8;
  const_string local_4d0;
  const_string local_4c0;
  char *local_4b0;
  char *local_4a8;
  const_string local_4a0;
  const_string local_490;
  char *local_480;
  char *local_478;
  const_string local_470;
  const_string local_460;
  char *local_450;
  char *local_448;
  const_string local_440;
  const_string local_430;
  char *local_420;
  char *local_418;
  const_string local_410;
  const_string local_400;
  char *local_3f0;
  char *local_3e8;
  const_string local_3e0;
  const_string local_3d0;
  char *local_3c0;
  char *local_3b8;
  const_string local_3b0;
  const_string local_3a0;
  char *local_390;
  char *local_388;
  const_string local_380;
  const_string local_370;
  char *local_360;
  char *local_358;
  const_string local_350;
  const_string local_340;
  char *local_330;
  char *local_328;
  const_string local_320;
  const_string local_310;
  char *local_300;
  char *local_2f8;
  const_string local_2f0;
  const_string local_2e0;
  char *local_2d0;
  char *local_2c8;
  const_string local_2c0;
  const_string local_2b0;
  char *local_2a0;
  char *local_298;
  const_string local_290;
  const_string local_280;
  char *local_270;
  char *local_268;
  const_string local_260;
  const_string local_250;
  char *local_240;
  char *local_238;
  const_string local_230;
  const_string local_220;
  char *local_210;
  char *local_208;
  const_string local_200;
  const_string local_1f0;
  char *local_1e0;
  char *local_1d8;
  const_string local_1d0;
  const_string local_1c0;
  char *local_1b0;
  char *local_1a8;
  const_string local_1a0;
  const_string local_190;
  char *local_180;
  char *local_178;
  const_string local_170;
  const_string local_160;
  char *local_150;
  char *local_148;
  const_string local_140;
  const_string local_130;
  char *local_120;
  char *local_118;
  const_string local_110;
  const_string local_100;
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  char *local_c0;
  char *local_b8;
  const_string local_b0;
  const_string local_a0;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  ob.pimpl_.px = (element_type *)anon_var_dwarf_8f9cc;
  ob.pimpl_.pn.pi_ = (sp_counted_base *)0x1ba178;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&ob);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  dataSize = CONCAT71(dataSize._1_7_,1);
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "TestDiscard";
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&dataSize,&local_7d0);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&dataSize);
  pOVar2 = &ob;
  avro::OutputBuffer::OutputBuffer(pOVar2,0);
  dataSize = 0x2800;
  addDataToBuffer(pOVar2,0x2800);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar2,&local_40,0xa0,&local_50);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_808 = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_7d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ea848;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_58 = "";
  remainder = (ob.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_60,0xa0,1,2,&remainder,"ob.size()",&dataSize,"dataSize");
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_70,0xa1,&local_80);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_88 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  _chunks = 0x800;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_90,0xa1,1,2,&remainder,"ob.freeSpace()",&chunks,"kDefaultBlockSize/2");
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_a0,0xa2,&local_b0);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_b8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  chunks = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_c0,0xa2,1,2,&remainder,"ob.numChunks()",&chunks,"1");
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_d0,0xa3,&local_e0);
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_e8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  chunks = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7d0,&local_f0,0xa3,1,2,&remainder,"ob.numDataChunks()",&chunks,"3");
  this = ob.pimpl_.px;
  avro::detail::BufferImpl::discardData(ob.pimpl_.px);
  local_100.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_100.m_end = "";
  local_110.m_begin = "";
  local_110.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_100,0xa7,&local_110);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_118 = "";
  remainder = (ob.pimpl_.px)->size_;
  _chunks = (ulong)uStack_80c << 0x20;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (plVar3,&local_120,0xa7,1,2,&remainder,"ob.size()",&chunks,"0U");
  local_130.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_130.m_end = "";
  local_140.m_begin = "";
  local_140.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_130,0xa8,&local_140);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_148 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  _chunks = 0x800;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_150,0xa8,1,2,&remainder,"ob.freeSpace()",&chunks,"kDefaultBlockSize/2");
  local_160.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_160.m_end = "";
  local_170.m_begin = "";
  local_170.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_160,0xa9,&local_170);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_178 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  chunks = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_180,0xa9,1,2,&remainder,"ob.numChunks()",&chunks,"1");
  local_190.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_190.m_end = "";
  local_1a0.m_begin = "";
  local_1a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_190,0xaa,&local_1a0);
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1a8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  _chunks = (ulong)uStack_80c << 0x20;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7d0,&local_1b0,0xaa,1,2,&remainder,"ob.numDataChunks()",&chunks,"0");
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  pOVar2 = &ob;
  avro::OutputBuffer::OutputBuffer(pOVar2,0);
  dataSize = 0x2800;
  addDataToBuffer(pOVar2,0x2800);
  local_1c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1c0.m_end = "";
  local_1d0.m_begin = "";
  local_1d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar2,&local_1c0,0xb3,&local_1d0);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1d8 = "";
  remainder = (ob.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_1e0,0xb3,1,2,&remainder,"ob.size()",&dataSize,"dataSize");
  local_1f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1f0.m_end = "";
  local_200.m_begin = "";
  local_200.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_1f0,0xb4,&local_200);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_208 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  _chunks = 0x800;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_210,0xb4,1,2,&remainder,"ob.freeSpace()",&chunks,"kDefaultBlockSize/2");
  local_220.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_220.m_end = "";
  local_230.m_begin = "";
  local_230.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_220,0xb5,&local_230);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_238 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  chunks = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_240,0xb5,1,2,&remainder,"ob.numChunks()",&chunks,"1");
  local_250.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_250.m_end = "";
  local_260.m_begin = "";
  local_260.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_250,0xb6,&local_260);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_268 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  _chunks = CONCAT44(uStack_80c,3);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_270,0xb6,1,2,&remainder,"ob.numDataChunks()",&chunks,"3");
  local_280.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_280.m_end = "";
  local_290.m_begin = "";
  local_290.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_280,0xba,&local_290);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_298 = "";
  remainder = (ob.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_2a0,0xba,1,2,&remainder,"ob.size()",&dataSize,"dataSize");
  local_2b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2b0.m_end = "";
  local_2c0.m_begin = "";
  local_2c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_2b0,0xbb,&local_2c0);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2c8 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  _chunks = 0x800;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_2d0,0xbb,1,2,&remainder,"ob.freeSpace()",&chunks,"kDefaultBlockSize/2");
  local_2e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2e0.m_end = "";
  local_2f0.m_begin = "";
  local_2f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_2e0,0xbc,&local_2f0);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2f8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  chunks = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_300,0xbc,1,2,&remainder,"ob.numChunks()",&chunks,"1");
  local_310.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_310.m_end = "";
  local_320.m_begin = "";
  local_320.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_310,0xbd,&local_320);
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_328 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  _chunks = CONCAT44(uStack_80c,3);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7d0,&local_330,0xbd,1,2,&remainder,"ob.numDataChunks()",&chunks,"3");
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  pOVar2 = &ob;
  avro::OutputBuffer::OutputBuffer(pOVar2,0);
  dataSize = 0x2800;
  addDataToBuffer(pOVar2,0x2800);
  local_340.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_340.m_end = "";
  local_350.m_begin = "";
  local_350.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar2,&local_340,0xc6,&local_350);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_358 = "";
  remainder = (ob.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_360,0xc6,1,2,&remainder,"ob.size()",&dataSize,"dataSize");
  local_370.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_370.m_end = "";
  local_380.m_begin = "";
  local_380.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_370,199,&local_380);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_388 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  _chunks = 0x800;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_390,199,1,2,&remainder,"ob.freeSpace()",&chunks,"kDefaultBlockSize/2");
  local_3a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3a0.m_end = "";
  local_3b0.m_begin = "";
  local_3b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_3a0,200,&local_3b0);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3b8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  chunks = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_3c0,200,1,2,&remainder,"ob.numChunks()",&chunks,"1");
  local_3d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3d0.m_end = "";
  local_3e0.m_begin = "";
  local_3e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_3d0,0xc9,&local_3e0);
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3e8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  _chunks = CONCAT44(uStack_80c,3);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7d0,&local_3f0,0xc9,1,2,&remainder,"ob.numDataChunks()",&chunks,"3");
  pOVar2 = &ob;
  avro::OutputBuffer::discardData(pOVar2,0x1000);
  local_400.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_400.m_end = "";
  local_410.m_begin = "";
  local_410.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar2,&local_400,0xcd,&local_410);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_418 = "";
  remainder = (ob.pimpl_.px)->size_;
  _chunks = dataSize - 0x1000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_420,0xcd,1,2,&remainder,"ob.size()",&chunks,
             "dataSize - kDefaultBlockSize");
  local_430.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_430.m_end = "";
  local_440.m_begin = "";
  local_440.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_430,0xce,&local_440);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_448 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  _chunks = 0x800;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_450,0xce,1,2,&remainder,"ob.freeSpace()",&chunks,"kDefaultBlockSize/2");
  local_460.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_460.m_end = "";
  local_470.m_begin = "";
  local_470.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_460,0xcf,&local_470);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_478 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  chunks = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_480,0xcf,1,2,&remainder,"ob.numChunks()",&chunks,"1");
  local_490.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_490.m_end = "";
  local_4a0.m_begin = "";
  local_4a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_490,0xd0,&local_4a0);
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_4a8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  _chunks = CONCAT44(uStack_80c,2);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7d0,&local_4b0,0xd0,1,2,&remainder,"ob.numDataChunks()",&chunks,"2");
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  pOVar2 = &ob;
  avro::OutputBuffer::OutputBuffer(pOVar2,0);
  dataSize = 0x2800;
  addDataToBuffer(pOVar2,0x2800);
  local_4c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_4c0.m_end = "";
  local_4d0.m_begin = "";
  local_4d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar2,&local_4c0,0xd8,&local_4d0);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_4d8 = "";
  remainder = (ob.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_4e0,0xd8,1,2,&remainder,"ob.size()",&dataSize,"dataSize");
  local_4f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_4f0.m_end = "";
  local_500.m_begin = "";
  local_500.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_4f0,0xd9,&local_500);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_508 = "";
  remainder = (ob.pimpl_.px)->freeSpace_;
  _chunks = 0x800;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_510,0xd9,1,2,&remainder,"ob.freeSpace()",&chunks,"kDefaultBlockSize/2");
  local_520.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_520.m_end = "";
  local_530.m_begin = "";
  local_530.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_520,0xda,&local_530);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_538 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  chunks = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_540,0xda,1,2,&remainder,"ob.numChunks()",&chunks,"1");
  local_550.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_550.m_end = "";
  local_560.m_begin = "";
  local_560.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_550,0xdb,&local_560);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_568 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  remainder = CONCAT44(remainder._4_4_,(int)sVar1);
  _chunks = CONCAT44(uStack_80c,3);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_570,0xdb,1,2,&remainder,"ob.numDataChunks()",&chunks,"3");
  uVar4 = 100;
  remainder = dataSize % 100;
  while (100 < (ob.pimpl_.px)->size_) {
    pOVar2 = &ob;
    avro::OutputBuffer::discardData(pOVar2,100);
    dataSize = dataSize - 100;
    local_700.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_700.m_end = "";
    local_710.m_begin = "";
    local_710.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)pOVar2,&local_700,0xe6,&local_710);
    local_7d0.m_empty = false;
    local_7d0._vptr_lazy_ostream = local_808;
    local_7c0 = &boost::unit_test::lazy_ostream::inst;
    local_7b8 = "";
    local_720 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_718 = "";
    _chunks = (ob.pimpl_.px)->size_;
    plVar3 = &local_7d0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_7d0,&local_720,0xe6,1,2,&chunks,"ob.size()",&dataSize,"dataSize");
    local_730.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_730.m_end = "";
    local_740.m_begin = "";
    local_740.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)plVar3,&local_730,0xe7,&local_740);
    local_7d0.m_empty = false;
    local_7d0._vptr_lazy_ostream = local_808;
    local_7c0 = &boost::unit_test::lazy_ostream::inst;
    local_7b8 = "";
    local_750 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_748 = "";
    _chunks = (ob.pimpl_.px)->freeSpace_;
    local_7f8 = 0x800;
    plVar3 = &local_7d0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_7d0,&local_750,0xe7,1,2,&chunks,"ob.freeSpace()",&local_7f8,
               "kDefaultBlockSize/2");
    local_760.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_760.m_end = "";
    local_770.m_begin = "";
    local_770.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)plVar3,&local_760,0xe8,&local_770);
    local_7d0.m_empty = false;
    local_7d0._vptr_lazy_ostream = local_808;
    local_7c0 = &boost::unit_test::lazy_ostream::inst;
    local_7b8 = "";
    local_780 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_778 = "";
    sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                      (&(ob.pimpl_.px)->writeChunks_);
    local_7f8._0_4_ = 1;
    plVar3 = &local_7d0;
    chunks = (int)sVar1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_7d0,&local_780,0xe8,1,2,&chunks,"ob.numChunks()",&local_7f8,"1");
    _chunks = CONCAT44(uStack_80c,3 - (int)(uVar4 >> 0xc));
    local_790.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_790.m_end = "";
    local_7a0.m_begin = "";
    local_7a0.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)plVar3,&local_790,0xeb,&local_7a0);
    local_7d0.m_empty = false;
    local_7d0._vptr_lazy_ostream = local_808;
    local_7c0 = &boost::unit_test::lazy_ostream::inst;
    local_7b8 = "";
    local_7b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
    ;
    local_7a8 = "";
    sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                      (&(ob.pimpl_.px)->readChunks_);
    local_7f8 = CONCAT44(local_7f8._4_4_,(int)sVar1);
    plVar3 = &local_7d0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_7d0,&local_7b0,0xeb,1,2,&local_7f8,"ob.numDataChunks()",&chunks,"chunks");
    uVar4 = uVar4 + 100;
  }
  local_580.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_580.m_end = "";
  local_590.m_begin = "";
  local_590.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_580,0xee,&local_590);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_598 = "";
  _chunks = (ob.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_5a0,0xee,1,2,&chunks,"ob.size()",&remainder,"remainder");
  local_5b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_5b0.m_end = "";
  local_5c0.m_begin = "";
  local_5c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_5b0,0xef,&local_5c0);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_5c8 = "";
  _chunks = (ob.pimpl_.px)->freeSpace_;
  local_7f8 = 0x800;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_5d0,0xef,1,2,&chunks,"ob.freeSpace()",&local_7f8,"kDefaultBlockSize/2");
  local_5e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_5e0.m_end = "";
  local_5f0.m_begin = "";
  local_5f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_5e0,0xf0,&local_5f0);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_5f8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  local_7f8._0_4_ = 1;
  chunks = (int)sVar1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_600,0xf0,1,2,&chunks,"ob.numChunks()",&local_7f8,"1");
  local_610.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_610.m_end = "";
  local_620.m_begin = "";
  local_620.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_610,0xf1,&local_620);
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_628 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  _chunks = CONCAT44(uStack_80c,(int)sVar1);
  local_7f8._0_4_ = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7d0,&local_630,0xf1,1,2,&chunks,"ob.numDataChunks()",&local_7f8,"1");
  avro::OutputBuffer::discardData(&ob,(ob.pimpl_.px)->size_ + 1);
  pOVar2 = &ob;
  avro::OutputBuffer::discardData(pOVar2,(ob.pimpl_.px)->size_);
  local_640.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_640.m_end = "";
  local_650.m_begin = "";
  local_650.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar2,&local_640,0xfb,&local_650);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_658 = "";
  _chunks = (ob.pimpl_.px)->size_;
  local_7f8 = (ulong)local_7f8._4_4_ << 0x20;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (plVar3,&local_660,0xfb,1,2,&chunks,"ob.size()",&local_7f8,"0U");
  local_670.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_670.m_end = "";
  local_680.m_begin = "";
  local_680.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_670,0xfc,&local_680);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_688 = "";
  _chunks = (ob.pimpl_.px)->freeSpace_;
  local_7f8 = 0x800;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (plVar3,&local_690,0xfc,1,2,&chunks,"ob.freeSpace()",&local_7f8,"kDefaultBlockSize/2");
  local_6a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_6a0.m_end = "";
  local_6b0.m_begin = "";
  local_6b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_6a0,0xfd,&local_6b0);
  plVar3 = &local_7d0;
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_6b8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->writeChunks_);
  local_7f8._0_4_ = 1;
  chunks = (int)sVar1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (plVar3,&local_6c0,0xfd,1,2,&chunks,"ob.numChunks()",&local_7f8,"1");
  local_6d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_6d0.m_end = "";
  local_6e0.m_begin = "";
  local_6e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar3,&local_6d0,0xfe,&local_6e0);
  local_7d0.m_empty = false;
  local_7d0._vptr_lazy_ostream = local_808;
  local_7c0 = &boost::unit_test::lazy_ostream::inst;
  local_7b8 = "";
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_6e8 = "";
  sVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::size
                    (&(ob.pimpl_.px)->readChunks_);
  _chunks = CONCAT44(uStack_80c,(int)sVar1);
  local_7f8 = (ulong)local_7f8._4_4_ << 0x20;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_7d0,&local_6f0,0xfe,1,2,&chunks,"ob.numDataChunks()",&local_7f8,"0");
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  return;
}

Assistant:

void TestDiscard()
{
    BOOST_TEST_MESSAGE( "TestDiscard");
    {
        OutputBuffer ob;
        size_t dataSize = kDefaultBlockSize*2 + kDefaultBlockSize/2;
        addDataToBuffer(ob, dataSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);

        ob.discardData();

        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);
    }

    {
        // discard no bytes
        OutputBuffer ob;
        size_t dataSize = kDefaultBlockSize*2 + kDefaultBlockSize/2;
        addDataToBuffer(ob, dataSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);

        ob.discardData(0);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);
    }

    { 
        // discard exactly one block
        OutputBuffer ob;
        size_t dataSize = kDefaultBlockSize*2 + kDefaultBlockSize/2;
        addDataToBuffer(ob, dataSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);

        ob.discardData(kDefaultBlockSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize - kDefaultBlockSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 2);
    }

    {
        OutputBuffer ob;
        size_t dataSize = kDefaultBlockSize*2 + kDefaultBlockSize/2;
        addDataToBuffer(ob, dataSize);

        BOOST_CHECK_EQUAL(ob.size(), dataSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 3);

        size_t remainder = dataSize % 100;

        // discard data 100 bytes at a time
        size_t discarded = 0;
        while(ob.size() > 100) {
            ob.discardData(100);
            dataSize -= 100;
            discarded += 100;

            BOOST_CHECK_EQUAL(ob.size(), dataSize);
            BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
            BOOST_CHECK_EQUAL(ob.numChunks(), 1);

            int chunks = 3 - (discarded / kDefaultBlockSize);
            BOOST_CHECK_EQUAL(ob.numDataChunks(), chunks);
        }

        BOOST_CHECK_EQUAL(ob.size(), remainder);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 1);

        try {
            ob.discardData(ob.size()+1);
        }
        catch (std::exception &e) {
            std::cout << "Intentionally triggered exception: " << e.what() << std::endl; 
        }
        ob.discardData(ob.size());

        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 0);
    }
}